

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

bool __thiscall mpt::slice::trim(slice *this,ssize_t len)

{
  size_t sVar1;
  ssize_t len_local;
  slice *this_local;
  
  if (len < 0) {
    sVar1 = array::length(&this->super_array);
    if (sVar1 < (this->_off + this->_len) - len) {
      return false;
    }
  }
  else if (this->_len < (ulong)len) {
    return false;
  }
  this->_len = this->_len - len;
  return true;
}

Assistant:

bool slice::trim(ssize_t len)
{
	if (len < 0) {
		if (length() < (_off + _len - len)) {
			return false;
		}
	}
	else if ((size_t) len > _len) {
		return false;
	}
	_len -= len;
	return true;
}